

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_cheat.cpp
# Opt level: O1

void cht_Give(player_t *player,char *name,int amount)

{
  APlayerPawn *this;
  PClassWeapon *type;
  BYTE *pBVar1;
  bool bVar2;
  undefined8 *puVar3;
  bool bVar4;
  int iVar5;
  undefined8 *puVar6;
  PClassInventory *pPVar7;
  AActor *pAVar8;
  AInventory *pAVar9;
  PClassWeapon *pPVar10;
  PClassActor *pPVar11;
  PClassInventory *pPVar12;
  PClassActor *pPVar13;
  ulong uVar14;
  bool bVar15;
  DVector3 local_58;
  AWeapon *local_40;
  FWeaponSlots *local_38;
  
  if ((player_t *)(&players + (long)consoleplayer * 0x54) != player) {
    puVar3 = (undefined8 *)
             ((long)&((player->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                     .Nodes)->Next +
             (ulong)(((player->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                      .Size - 1 & 0x1ea) * 0x18));
    do {
      puVar6 = puVar3;
      puVar3 = (undefined8 *)*puVar6;
    } while (*(int *)(puVar6 + 1) != 0x1ea);
    Printf("%s is a cheater: give %s\n",*(undefined8 *)(puVar6[2] + 0x28),name);
  }
  this = player->mo;
  if (this == (APlayerPawn *)0x0) {
    return;
  }
  if (player->health < 1) {
    return;
  }
  iVar5 = strcasecmp(name,"all");
  if (iVar5 == 0) {
    bVar2 = false;
    bVar15 = false;
  }
  else {
    iVar5 = strcasecmp(name,"everything");
    bVar15 = iVar5 == 0;
    bVar2 = !bVar15;
  }
  iVar5 = strcasecmp(name,"health");
  if (iVar5 == 0) {
    if (amount < 1) {
      iVar5 = APlayerPawn::GetMaxHealth(this);
      (player->mo->super_AActor).health = iVar5;
    }
    else {
      iVar5 = (this->super_AActor).health + amount;
      (this->super_AActor).health = iVar5;
    }
    player->health = iVar5;
  }
  if ((bVar2) && (iVar5 = strcasecmp(name,"backpack"), iVar5 != 0)) {
    if ((!bVar2) || (iVar5 = strcasecmp(name,"ammo"), iVar5 == 0)) goto LAB_0039f80f;
    if ((!bVar2) || (iVar5 = strcasecmp(name,"armor"), iVar5 == 0)) goto LAB_0039f8cd;
    if ((!bVar2) || (iVar5 = strcasecmp(name,"keys"), iVar5 == 0)) goto LAB_0039f9d8;
    if ((!bVar2) || (iVar5 = strcasecmp(name,"weapons"), iVar5 == 0)) goto LAB_0039fa91;
    if ((bVar2) && (iVar5 = strcasecmp(name,"artifacts"), iVar5 != 0)) {
      if ((bVar2) && (iVar5 = strcasecmp(name,"puzzlepieces"), iVar5 != 0)) {
        if (!bVar2) {
          return;
        }
        pPVar7 = (PClassInventory *)PClass::FindActor(name);
        if (pPVar7 == (PClassInventory *)0x0) {
LAB_0039fdd6:
          if ((player_t *)(&players + (long)consoleplayer * 0x54) != player) {
            return;
          }
          Printf("Unknown item \"%s\"\n",name);
          return;
        }
        pPVar12 = pPVar7;
        if (pPVar7 != (PClassInventory *)AInventory::RegistrationInfo.MyClass) {
          do {
            pPVar12 = (PClassInventory *)(pPVar12->super_PClassActor).super_PClass.ParentClass;
            if (pPVar12 == (PClassInventory *)AInventory::RegistrationInfo.MyClass) break;
          } while (pPVar12 != (PClassInventory *)0x0);
          if (pPVar12 == (PClassInventory *)0x0) goto LAB_0039fdd6;
        }
        AActor::GiveInventory(&player->mo->super_AActor,pPVar7,amount,true);
        return;
      }
      if (PClassActor::AllActorClasses.Count == 0) {
        return;
      }
      goto LAB_0039fd23;
    }
  }
  else {
    pPVar7 = (PClassInventory *)PClass::FindActor(&gameinfo.backpacktype);
    if (pPVar7 != (PClassInventory *)0x0) {
      AActor::GiveInventory(&player->mo->super_AActor,pPVar7,1,true);
    }
    if (bVar2) {
      return;
    }
LAB_0039f80f:
    if (PClassActor::AllActorClasses.Count != 0) {
      uVar14 = 0;
      do {
        pPVar11 = PClassActor::AllActorClasses.Array[uVar14];
        if ((pPVar11->super_PClass).ParentClass == AAmmo::RegistrationInfo.MyClass) {
          pAVar9 = AActor::FindInventory(&player->mo->super_AActor,pPVar11,false);
          if (pAVar9 == (AInventory *)0x0) {
            local_58.X = 0.0;
            local_58.Y = 0.0;
            local_58.Z = 0.0;
            pAVar8 = AActor::StaticSpawn(pPVar11,&local_58,NO_REPLACE,false);
            (*(pAVar8->super_DThinker).super_DObject._vptr_DObject[0x29])(pAVar8,player->mo);
            *(undefined4 *)&pAVar8[1].super_DThinker.super_DObject.Class =
                 *(undefined4 *)((long)&pAVar8[1].super_DThinker.super_DObject.Class + 4);
          }
          else if (pAVar9->Amount < pAVar9->MaxAmount) {
            pAVar9->Amount = pAVar9->MaxAmount;
          }
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < PClassActor::AllActorClasses.Count);
    }
    if (bVar2) {
      return;
    }
LAB_0039f8cd:
    if (gameinfo.gametype == GAME_Hexen) {
      iVar5 = 0;
      do {
        local_58.X = 0.0;
        local_58.Y = 0.0;
        local_58.Z = 0.0;
        pAVar9 = (AInventory *)
                 AActor::StaticSpawn((PClassActor *)AHexenArmor::RegistrationInfo.MyClass,&local_58,
                                     NO_REPLACE,false);
        (pAVar9->super_AActor).health = iVar5;
        pAVar9->Amount = 0;
        bVar4 = AInventory::CallTryPickup(pAVar9,&player->mo->super_AActor,(AActor **)0x0);
        if (!bVar4) {
          (*(pAVar9->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar9);
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 != 4);
    }
    else {
      local_58.X = 0.0;
      local_58.Y = 0.0;
      local_58.Z = 0.0;
      pAVar9 = (AInventory *)
               AActor::StaticSpawn((PClassActor *)ABasicArmorPickup::RegistrationInfo.MyClass,
                                   &local_58,NO_REPLACE,false);
      *(int *)&pAVar9[1].super_AActor.super_DThinker.super_DObject.ObjNext = deh.BlueAC * 100;
      pAVar9[1].super_AActor.super_DThinker.super_DObject._vptr_DObject =
           (_func_int **)
           (~-(ulong)(0.0 < gameinfo.Armor2Percent) & 0x3fe0000000000000 |
           (ulong)gameinfo.Armor2Percent & -(ulong)(0.0 < gameinfo.Armor2Percent));
      bVar4 = AInventory::CallTryPickup(pAVar9,&player->mo->super_AActor,(AActor **)0x0);
      if (!bVar4) {
        (*(pAVar9->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar9);
      }
    }
    if (bVar2) {
      return;
    }
LAB_0039f9d8:
    if (PClassActor::AllActorClasses.Count != 0) {
      uVar14 = 0;
      do {
        pPVar11 = PClassActor::AllActorClasses.Array[uVar14];
        pPVar13 = pPVar11;
        if (pPVar11 == (PClassActor *)AKey::RegistrationInfo.MyClass) {
LAB_0039fa27:
          if ((pPVar11->super_PClass).Defaults[0x4fc] != '\0') {
            local_58.X = 0.0;
            local_58.Y = 0.0;
            local_58.Z = 0.0;
            pAVar9 = (AInventory *)AActor::StaticSpawn(pPVar11,&local_58,NO_REPLACE,false);
            bVar4 = AInventory::CallTryPickup(pAVar9,&player->mo->super_AActor,(AActor **)0x0);
            if (!bVar4) {
              (*(pAVar9->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar9);
            }
          }
        }
        else {
          do {
            pPVar13 = (PClassActor *)(pPVar13->super_PClass).ParentClass;
            if (pPVar13 == (PClassActor *)AKey::RegistrationInfo.MyClass) break;
          } while (pPVar13 != (PClassActor *)0x0);
          if (pPVar13 != (PClassActor *)0x0) goto LAB_0039fa27;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < PClassActor::AllActorClasses.Count);
    }
    if (bVar2) {
      return;
    }
LAB_0039fa91:
    local_40 = player->PendingWeapon;
    if (PClassActor::AllActorClasses.Count != 0) {
      local_38 = &player->weapons;
      uVar14 = 0;
      do {
        type = (PClassWeapon *)PClassActor::AllActorClasses.Array[uVar14];
        pPVar10 = type;
        if (type != (PClassWeapon *)AWeapon::RegistrationInfo.MyClass) {
          do {
            pPVar10 = (PClassWeapon *)
                      (pPVar10->super_PClassInventory).super_PClassActor.super_PClass.ParentClass;
            if (pPVar10 == (PClassWeapon *)AWeapon::RegistrationInfo.MyClass) break;
          } while (pPVar10 != (PClassWeapon *)0x0);
          if (pPVar10 != (PClassWeapon *)0x0) {
            pPVar10 = (PClassWeapon *)PClassActor::GetReplacement((PClassActor *)type,true);
            if ((pPVar10 != type) &&
               (pPVar11 = PClassActor::GetReplacement((PClassActor *)type,true),
               pPVar11 != (PClassActor *)ADehackedPickup::RegistrationInfo.MyClass)) {
              do {
                pPVar11 = (PClassActor *)(pPVar11->super_PClass).ParentClass;
                if (pPVar11 == (PClassActor *)ADehackedPickup::RegistrationInfo.MyClass) break;
              } while (pPVar11 != (PClassActor *)0x0);
              if (pPVar11 == (PClassActor *)0x0) goto LAB_0039fb7e;
            }
            bVar4 = FWeaponSlots::LocateWeapon(local_38,type,(int *)0x0,(int *)0x0);
            if ((bVar4) &&
               ((bVar15 ||
                (((type->super_PClassInventory).super_PClassActor.super_PClass.Defaults[0x4ff] & 8)
                 == 0)))) {
              AActor::GiveInventory(&player->mo->super_AActor,(PClassInventory *)type,1,true);
            }
          }
        }
LAB_0039fb7e:
        uVar14 = uVar14 + 1;
      } while (uVar14 < PClassActor::AllActorClasses.Count);
    }
    player->PendingWeapon = local_40;
    if (bVar2) {
      return;
    }
  }
  if (PClassActor::AllActorClasses.Count != 0) {
    uVar14 = 0;
    do {
      pPVar7 = (PClassInventory *)PClassActor::AllActorClasses.Array[uVar14];
      pPVar12 = pPVar7;
      if (pPVar7 == (PClassInventory *)AInventory::RegistrationInfo.MyClass) {
LAB_0039fc07:
        pBVar1 = (pPVar7->super_PClassActor).super_PClass.Defaults;
        if (((0 < *(int *)(pBVar1 + 0x4d8)) && (1 < *(int *)(pBVar1 + 0x4cc))) &&
           (pPVar12 = pPVar7, pPVar7 != (PClassInventory *)APuzzleItem::RegistrationInfo.MyClass)) {
          do {
            pPVar12 = (PClassInventory *)(pPVar12->super_PClassActor).super_PClass.ParentClass;
            if (pPVar12 == (PClassInventory *)APuzzleItem::RegistrationInfo.MyClass) break;
          } while (pPVar12 != (PClassInventory *)0x0);
          if ((pPVar12 == (PClassInventory *)0x0) &&
             (pPVar12 = pPVar7, pPVar7 != (PClassInventory *)APowerup::RegistrationInfo.MyClass)) {
            do {
              pPVar12 = (PClassInventory *)(pPVar12->super_PClassActor).super_PClass.ParentClass;
              if (pPVar12 == (PClassInventory *)APowerup::RegistrationInfo.MyClass) break;
            } while (pPVar12 != (PClassInventory *)0x0);
            if ((pPVar12 == (PClassInventory *)0x0) &&
               (pPVar12 = pPVar7, pPVar7 != (PClassInventory *)AArmor::RegistrationInfo.MyClass)) {
              do {
                pPVar12 = (PClassInventory *)(pPVar12->super_PClassActor).super_PClass.ParentClass;
                if (pPVar12 == (PClassInventory *)AArmor::RegistrationInfo.MyClass) break;
              } while (pPVar12 != (PClassInventory *)0x0);
              if ((pPVar12 == (PClassInventory *)0x0) &&
                 ((bVar15 ||
                  (pPVar12 = (PClassInventory *)
                             PClassActor::GetReplacement((PClassActor *)pPVar7,true),
                  pPVar12 == pPVar7)))) {
                iVar5 = amount;
                if (amount < 1) {
                  iVar5 = *(int *)(pBVar1 + 0x4cc);
                }
                AActor::GiveInventory(&player->mo->super_AActor,pPVar7,iVar5,true);
              }
            }
          }
        }
      }
      else {
        do {
          pPVar12 = (PClassInventory *)(pPVar12->super_PClassActor).super_PClass.ParentClass;
          if (pPVar12 == (PClassInventory *)AInventory::RegistrationInfo.MyClass) break;
        } while (pPVar12 != (PClassInventory *)0x0);
        if (pPVar12 != (PClassInventory *)0x0) goto LAB_0039fc07;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < PClassActor::AllActorClasses.Count);
  }
  if (bVar2 || PClassActor::AllActorClasses.Count == 0) {
    return;
  }
LAB_0039fd23:
  uVar14 = 0;
  do {
    pPVar7 = (PClassInventory *)PClassActor::AllActorClasses.Array[uVar14];
    pPVar12 = pPVar7;
    if (pPVar7 == (PClassInventory *)APuzzleItem::RegistrationInfo.MyClass) {
LAB_0039fd5e:
      pBVar1 = (pPVar7->super_PClassActor).super_PClass.Defaults;
      if ((0 < *(int *)(pBVar1 + 0x4d8)) &&
         ((bVar15 ||
          (pPVar12 = (PClassInventory *)PClassActor::GetReplacement((PClassActor *)pPVar7,true),
          pPVar12 == pPVar7)))) {
        iVar5 = amount;
        if (amount < 1) {
          iVar5 = *(int *)(pBVar1 + 0x4cc);
        }
        AActor::GiveInventory(&player->mo->super_AActor,pPVar7,iVar5,true);
      }
    }
    else {
      do {
        pPVar12 = (PClassInventory *)(pPVar12->super_PClassActor).super_PClass.ParentClass;
        if (pPVar12 == (PClassInventory *)APuzzleItem::RegistrationInfo.MyClass) break;
      } while (pPVar12 != (PClassInventory *)0x0);
      if (pPVar12 != (PClassInventory *)0x0) goto LAB_0039fd5e;
    }
    uVar14 = uVar14 + 1;
    if (PClassActor::AllActorClasses.Count <= uVar14) {
      return;
    }
  } while( true );
}

Assistant:

void cht_Give (player_t *player, const char *name, int amount)
{
	enum { ALL_NO, ALL_YES, ALL_YESYES } giveall;
	int i;
	PClassActor *type;

	if (player != &players[consoleplayer])
		Printf ("%s is a cheater: give %s\n", player->userinfo.GetName(), name);

	if (player->mo == NULL || player->health <= 0)
	{
		return;
	}

	giveall = ALL_NO;
	if (stricmp (name, "all") == 0)
	{
		giveall = ALL_YES;
	}
	else if (stricmp (name, "everything") == 0)
	{
		giveall = ALL_YESYES;
	}

	if (stricmp (name, "health") == 0)
	{
		if (amount > 0)
		{
			player->mo->health += amount;
			player->health = player->mo->health;
		}
		else
		{
			player->health = player->mo->health = player->mo->GetMaxHealth();
		}
	}

	if (giveall || stricmp (name, "backpack") == 0)
	{
		// Select the correct type of backpack based on the game
		type = PClass::FindActor(gameinfo.backpacktype);
		if (type != NULL)
		{
			player->mo->GiveInventory(static_cast<PClassInventory *>(type), 1, true);
		}

		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "ammo") == 0)
	{
		// Find every unique type of ammo. Give it to the player if
		// he doesn't have it already, and set each to its maximum.
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			PClassActor *type = PClassActor::AllActorClasses[i];

			if (type->ParentClass == RUNTIME_CLASS(AAmmo))
			{
				PClassAmmo *atype = static_cast<PClassAmmo *>(type);
				AInventory *ammo = player->mo->FindInventory(atype);
				if (ammo == NULL)
				{
					ammo = static_cast<AInventory *>(Spawn (atype));
					ammo->AttachToOwner (player->mo);
					ammo->Amount = ammo->MaxAmount;
				}
				else if (ammo->Amount < ammo->MaxAmount)
				{
					ammo->Amount = ammo->MaxAmount;
				}
			}
		}

		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "armor") == 0)
	{
		if (gameinfo.gametype != GAME_Hexen)
		{
			ABasicArmorPickup *armor = Spawn<ABasicArmorPickup> ();
			armor->SaveAmount = 100*deh.BlueAC;
			armor->SavePercent = gameinfo.Armor2Percent > 0? gameinfo.Armor2Percent : 0.5;
			if (!armor->CallTryPickup (player->mo))
			{
				armor->Destroy ();
			}
		}
		else
		{
			for (i = 0; i < 4; ++i)
			{
				AHexenArmor *armor = Spawn<AHexenArmor> ();
				armor->health = i;
				armor->Amount = 0;
				if (!armor->CallTryPickup (player->mo))
				{
					armor->Destroy ();
				}
			}
		}

		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "keys") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			if (PClassActor::AllActorClasses[i]->IsDescendantOf (RUNTIME_CLASS(AKey)))
			{
				AKey *key = (AKey *)GetDefaultByType (PClassActor::AllActorClasses[i]);
				if (key->KeyNumber != 0)
				{
					key = static_cast<AKey *>(Spawn(static_cast<PClassActor *>(PClassActor::AllActorClasses[i])));
					if (!key->CallTryPickup (player->mo))
					{
						key->Destroy ();
					}
				}
			}
		}
		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "weapons") == 0)
	{
		AWeapon *savedpending = player->PendingWeapon;
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];
			// Don't give replaced weapons unless the replacement was done by Dehacked.
			if (type != RUNTIME_CLASS(AWeapon) &&
				type->IsDescendantOf (RUNTIME_CLASS(AWeapon)) &&
				(static_cast<PClassActor *>(type)->GetReplacement() == type ||
				 static_cast<PClassActor *>(type)->GetReplacement()->IsDescendantOf(RUNTIME_CLASS(ADehackedPickup))))
			{
				// Give the weapon only if it belongs to the current game or
				if (player->weapons.LocateWeapon(static_cast<PClassWeapon*>(type), NULL, NULL))
				{
					AWeapon *def = (AWeapon*)GetDefaultByType (type);
					if (giveall == ALL_YESYES || !(def->WeaponFlags & WIF_CHEATNOTWEAPON))
					{
						player->mo->GiveInventory(static_cast<PClassInventory *>(type), 1, true);
					}
				}
			}
		}
		player->PendingWeapon = savedpending;

		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "artifacts") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];
			if (type->IsDescendantOf (RUNTIME_CLASS(AInventory)))
			{
				AInventory *def = (AInventory*)GetDefaultByType (type);
				if (def->Icon.isValid() && def->MaxAmount > 1 &&
					!type->IsDescendantOf (RUNTIME_CLASS(APuzzleItem)) &&
					!type->IsDescendantOf (RUNTIME_CLASS(APowerup)) &&
					!type->IsDescendantOf (RUNTIME_CLASS(AArmor)))
				{
					// Do not give replaced items unless using "give everything"
					if (giveall == ALL_YESYES || type->GetReplacement() == type)
					{
						player->mo->GiveInventory(static_cast<PClassInventory *>(type), amount <= 0 ? def->MaxAmount : amount, true);
					}
				}
			}
		}
		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "puzzlepieces") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];
			if (type->IsDescendantOf (RUNTIME_CLASS(APuzzleItem)))
			{
				AInventory *def = (AInventory*)GetDefaultByType (type);
				if (def->Icon.isValid())
				{
					// Do not give replaced items unless using "give everything"
					if (giveall == ALL_YESYES || type->GetReplacement() == type)
					{
						player->mo->GiveInventory(static_cast<PClassInventory *>(type), amount <= 0 ? def->MaxAmount : amount, true);
					}
				}
			}
		}
		if (!giveall)
			return;
	}

	if (giveall)
		return;

	type = PClass::FindActor(name);
	if (type == NULL || !type->IsDescendantOf (RUNTIME_CLASS(AInventory)))
	{
		if (player == &players[consoleplayer])
			Printf ("Unknown item \"%s\"\n", name);
	}
	else
	{
		player->mo->GiveInventory(static_cast<PClassInventory *>(type), amount, true);
	}
	return;
}